

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

void runSyncRetTests(void)

{
  uint8_t p4;
  uint16_t p3;
  CopyCounterGuy ccg1;
  bool p9;
  int8_t p8;
  uint64_t p1;
  int16_t p7;
  int32_t p6;
  int64_t p5;
  undefined1 local_204 [4];
  TestClass app;
  
  TestClass::TestClass(&app);
  ccg1.mCount = 0;
  p1 = 0x400;
  p3 = 0x100;
  p4 = '\x10';
  p5 = -0x400;
  p6 = -0x200;
  p7 = -0x100;
  p8 = -0x10;
  p9 = true;
  TestClass::SyncRetFunc0(&app);
  TestClass::SyncRetFunc1(&app,&p1);
  TestClass::SyncRetFunc2(&app,&p1,0x200);
  TestClass::SyncRetFunc3(&app,&p1,0x200,&p3);
  TestClass::SyncRetFunc4(&app,&p1,0x200,&p3,&ccg1);
  TestClass::SyncRetFunc5
            ((TestClass *)local_204,(uint64_t *)&app,(uint32_t)&p1,(uint16_t *)0x200,
             (CopyCounterGuy *)&p3,(uint8_t *)&ccg1);
  TestClass::SyncRetFunc6(&app,&p1,0x200,&p3,&ccg1,&p4,&p5);
  TestClass::SyncRetFunc7(&app,&p1,0x200,&p3,&ccg1,&p4,&p5,&p6);
  TestClass::SyncRetFunc8(&app,&p1,0x200,&p3,&ccg1,&p4,&p5,&p6,&p7);
  TestClass::SyncRetFunc9(&app,&p1,0x200,&p3,&ccg1,&p4,&p5,&p6,&p7,&p8);
  TestClass::SyncRetFunc10(&app,&p1,0x200,&p3,&ccg1,&p4,&p5,&p6,&p7,&p8,&p9);
  EventThread::~EventThread(&app.mEventThread);
  return;
}

Assistant:

void runSyncRetTests()
{
	TestClass app;
	
	TestClass::CopyCounterGuy returnCCG;
	
	uint64_t p1 = 1024;
	uint32_t p2 = 512;
	uint16_t p3 = 256;
	TestClass::CopyCounterGuy ccg1;
	uint8_t p4 = 16;
	int64_t p5 = -1024;
	int32_t p6 = -512;
	int16_t p7 = -256;
	int8_t p8 = -16;
	bool p9 = true;
	
	app.SyncRetFunc0();
	app.SyncRetFunc1(p1);
	app.SyncRetFunc2(p1, p2);
	app.SyncRetFunc3(p1, p2, p3);
	app.SyncRetFunc4(p1, p2, p3, ccg1);
	returnCCG = app.SyncRetFunc5(p1, p2, p3, ccg1, p4);
	LOG_INFO("Total copies after SyncRetFunc5(%d)", returnCCG.getCount());
	app.SyncRetFunc6(p1, p2, p3, ccg1, p4, p5);
	app.SyncRetFunc7(p1, p2, p3, ccg1, p4, p5, p6);
	app.SyncRetFunc8(p1, p2, p3, ccg1, p4, p5, p6, p7);
	app.SyncRetFunc9(p1, p2, p3, ccg1, p4, p5, p6, p7, p8);
	app.SyncRetFunc10(p1, p2, p3, ccg1, p4, p5, p6, p7, p8, p9);
	
	LOG_INFO("SyncRet tests complete!");
}